

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

void __thiscall EmmyFacade::Hook(EmmyFacade *this,lua_State *L,lua_Debug *ar)

{
  bool bVar1;
  WorkMode WVar2;
  reference this_00;
  element_type *this_01;
  element_type *peVar3;
  initializer_list_t init;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  lua_State *local_88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_70;
  undefined1 local_60 [8];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  obj;
  undefined1 local_30 [8];
  shared_ptr<Debugger> debugger;
  lua_Debug *ar_local;
  lua_State *L_local;
  EmmyFacade *this_local;
  
  debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ar;
  GetDebugger((EmmyFacade *)local_30,(lua_State *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    bVar1 = Debugger::IsRunning(peVar3);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_30);
      Debugger::Hook(peVar3,(lua_Debug *)
                            debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,L);
    }
    else {
      WVar2 = GetWorkMode(this);
      if (WVar2 == EmmyCore) {
        if (luaVersion == LUA_JIT) {
          SetReadyHook(this,L);
        }
        else {
          peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
          bVar1 = Debugger::IsMainCoroutine(peVar3,L);
          if (bVar1) {
            SetReadyHook(this,L);
          }
        }
      }
    }
  }
  else if (this->workMode == Attach) {
    EmmyDebuggerManager::AddDebugger
              ((EmmyDebuggerManager *)&obj.m_value,(lua_State *)&this->_emmyDebuggerManager);
    std::shared_ptr<Debugger>::operator=
              ((shared_ptr<Debugger> *)local_30,(shared_ptr<Debugger> *)&obj.m_value);
    std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)&obj.m_value);
    install_emmy_debugger(L);
    bVar1 = EmmyDebuggerManager::IsRunning(&this->_emmyDebuggerManager);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_30);
      Debugger::Start(peVar3);
      peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_30);
      Debugger::Attach(peVar3);
    }
    std::
    initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::initializer_list(&local_70);
    init._M_len = (size_type)local_70._M_array;
    init._M_array = (iterator)local_60;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::object(init);
    local_88 = L;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json<long,_long,_0>(&local_80,(long *)&local_88);
    this_00 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)local_60,"state");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(this_00,&local_80);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_80);
    this_01 = std::__shared_ptr_access<Transporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Transporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->transporter);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_98,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_60);
    Transporter::Send(this_01,0xe,&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_98);
    peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    Debugger::Hook(peVar3,(lua_Debug *)
                          debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,L);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_60);
  }
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)local_30);
  return;
}

Assistant:

void EmmyFacade::Hook(lua_State *L, lua_Debug *ar) {
	auto debugger = GetDebugger(L);
	if (debugger) {
		if (!debugger->IsRunning()) {
			if (GetWorkMode() == WorkMode::EmmyCore) {
				if (luaVersion != LuaVersion::LUA_JIT) {
					if (debugger->IsMainCoroutine(L)) {
						SetReadyHook(L);
					}
				} else {
					SetReadyHook(L);
				}
			}
			return;
		}

		debugger->Hook(ar, L);
	} else {
		if (workMode == WorkMode::Attach) {
			debugger = _emmyDebuggerManager.AddDebugger(L);
			install_emmy_debugger(L);
			if (_emmyDebuggerManager.IsRunning()) {
				debugger->Start();
				debugger->Attach();
			}
			// send attached notify
			auto obj = nlohmann::json::object();
			obj["state"] = reinterpret_cast<int64_t>(L);

			this->transporter->Send(int(MessageCMD::AttachedNotify), obj);

			debugger->Hook(ar, L);
		}
	}
}